

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O2

void __thiscall
QUrlQuery::setQueryDelimiters(QUrlQuery *this,QChar valueDelimiter,QChar pairDelimiter)

{
  QUrlQueryPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QUrlQueryPrivate>::operator->(&this->d);
  (pQVar1->valueDelimiter).ucs = valueDelimiter.ucs;
  pQVar1 = QSharedDataPointer<QUrlQueryPrivate>::operator->(&this->d);
  (pQVar1->pairDelimiter).ucs = pairDelimiter.ucs;
  return;
}

Assistant:

void QUrlQuery::setQueryDelimiters(QChar valueDelimiter, QChar pairDelimiter)
{
    d->valueDelimiter = valueDelimiter;
    d->pairDelimiter = pairDelimiter;
}